

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

_ElementType * __thiscall
Lib::
CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:750:15),_false>_>,_Lib::IterTraits<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:763:12),_Inferences::InductionContext>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:767:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>_>_>
::next(CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:750:15),_false>_>,_Lib::IterTraits<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:763:12),_Inferences::InductionContext>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:767:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>_>_>
       *this)

{
  byte *in_RSI;
  CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:750:15),_false>_>,_Lib::IterTraits<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:763:12),_Inferences::InductionContext>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:767:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>_>_>
  *in_RDI;
  IterTraits<Lib::FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:750:15),_false>_>
  *in_stack_00000038;
  
  hasNext(in_RDI);
  if ((*in_RSI & 1) == 0) {
    IterTraits<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:763:12),_Inferences::InductionContext>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:767:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>_>
    ::next((IterTraits<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:763:12),_Inferences::InductionContext>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:767:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>_>
            *)in_stack_00000038);
  }
  else {
    IterTraits<Lib::FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:750:15),_false>_>
    ::next(in_stack_00000038);
  }
  return (_ElementType *)in_RDI;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }